

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

void DoubleToRational(double value,uint32_t *num,uint32_t *denom)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  uint64_t ullDenom2;
  uint64_t ullNum2;
  uint64_t ullDenom;
  uint64_t ullNum;
  
  if (value < 0.0) {
    *denom = 0;
    *num = 0;
    TIFFErrorExt((thandle_t)0x0,"TIFFLib: DoubleToRational()",
                 " Negative Value for Unsigned Rational given.");
    return;
  }
  if (value <= 4294967295.0) {
    dVar3 = (double)((long)value & 0xffffffff);
    if ((dVar3 != value) || (NAN(dVar3) || NAN(value))) {
      if (2.3283064370807974e-10 <= value) {
        ToRationalEuclideanGCD(value,0,0,&ullNum,&ullDenom);
        ToRationalEuclideanGCD(value,0,1,&ullNum2,&ullDenom2);
        if ((((ullNum >> 0x20 != 0) || (ullDenom >> 0x20 != 0)) || (ullNum2 >> 0x20 != 0)) ||
           (ullDenom2 >> 0x20 != 0)) {
          TIFFErrorExt((thandle_t)0x0,"TIFFLib: DoubleToRational()",
                       " Num or Denom exceeds ULONG: val=%14.6f, num=%12lu, denom=%12lu | num2=%12lu, denom2=%12lu"
                      );
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                        ,0xa9e,"void DoubleToRational(double, uint32_t *, uint32_t *)");
        }
        auVar2._0_8_ = ((double)(ullNum >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(ullNum & 0xffffffff | 0x4330000000000000);
        auVar2._8_8_ = ((double)(ullNum2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(ullNum2 & 0xffffffff | 0x4330000000000000);
        auVar5._0_8_ = ((double)(ullDenom >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(ullDenom & 0xffffffff | 0x4330000000000000);
        auVar5._8_8_ = ((double)(ullDenom2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(ullDenom2 & 0xffffffff | 0x4330000000000000);
        auVar2 = divpd(auVar2,auVar5);
        dVar3 = ABS(value - auVar2._0_8_);
        dVar4 = ABS(value - auVar2._8_8_);
        uVar1 = (uint32_t)ullNum2;
        if (dVar3 < dVar4) {
          uVar1 = (uint32_t)ullNum;
        }
        *num = uVar1;
        uVar1 = (uint32_t)ullDenom2;
        if (dVar3 < dVar4) {
          uVar1 = (uint32_t)ullDenom;
        }
        *denom = uVar1;
      }
      else {
        *num = 0;
        *denom = 0xffffffff;
      }
    }
    else {
      *num = (uint32_t)(long)value;
      *denom = 1;
    }
  }
  else {
    *num = 0xffffffff;
    *denom = 0;
  }
  return;
}

Assistant:

static void DoubleToRational(double value, uint32_t *num, uint32_t *denom)
{
    /*---- UN-SIGNED RATIONAL ---- */
    double dblDiff, dblDiff2;
    uint64_t ullNum, ullDenom, ullNum2, ullDenom2;

    /*-- Check for negative values. If so it is an error. */
    /* Test written that way to catch NaN */
    if (!(value >= 0))
    {
        *num = *denom = 0;
        TIFFErrorExt(0, "TIFFLib: DoubleToRational()",
                     " Negative Value for Unsigned Rational given.");
        return;
    }

    /*-- Check for too big numbers (> ULONG_MAX) -- */
    if (value > 0xFFFFFFFFUL)
    {
        *num = 0xFFFFFFFFU;
        *denom = 0;
        return;
    }
    /*-- Check for easy integer numbers -- */
    if (value == (uint32_t)(value))
    {
        *num = (uint32_t)value;
        *denom = 1;
        return;
    }
    /*-- Check for too small numbers for "unsigned long" type rationals -- */
    if (value < 1.0 / (double)0xFFFFFFFFUL)
    {
        *num = 0;
        *denom = 0xFFFFFFFFU;
        return;
    }

    /*-- There are two approaches using the Euclidean algorithm,
     *   which can accidentally lead to different accuracies just depending on
     * the value. Try both and define which one was better.
     */
    ToRationalEuclideanGCD(value, FALSE, FALSE, &ullNum, &ullDenom);
    ToRationalEuclideanGCD(value, FALSE, TRUE, &ullNum2, &ullDenom2);
    /*-- Double-Check, that returned values fit into ULONG :*/
    if (ullNum > 0xFFFFFFFFUL || ullDenom > 0xFFFFFFFFUL ||
        ullNum2 > 0xFFFFFFFFUL || ullDenom2 > 0xFFFFFFFFUL)
    {
        TIFFErrorExt(0, "TIFFLib: DoubleToRational()",
                     " Num or Denom exceeds ULONG: val=%14.6f, num=%12" PRIu64
                     ", denom=%12" PRIu64 " | num2=%12" PRIu64
                     ", denom2=%12" PRIu64 "",
                     value, ullNum, ullDenom, ullNum2, ullDenom2);
        assert(0);
    }

    /* Check, which one has higher accuracy and take that. */
    dblDiff = fabs(value - ((double)ullNum / (double)ullDenom));
    dblDiff2 = fabs(value - ((double)ullNum2 / (double)ullDenom2));
    if (dblDiff < dblDiff2)
    {
        *num = (uint32_t)ullNum;
        *denom = (uint32_t)ullDenom;
    }
    else
    {
        *num = (uint32_t)ullNum2;
        *denom = (uint32_t)ullDenom2;
    }
}